

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

void vepu511_h265_set_hw_address(H265eV511HalContext *ctx,H265eVepu511Frame *regs,HalEncTask *task)

{
  MppBuffer buffer;
  Vepu511H265eFrmCfg *pVVar1;
  H265eSyntax_new *pHVar2;
  MppDevRegOffCfgs *pMVar3;
  RK_U32 RVar4;
  HalBuf *pHVar5;
  HalBuf *pHVar6;
  size_t sVar7;
  H265eSyntax_new *syn;
  Vepu511H265eFrmCfg *frm;
  MppBuffer md_info_buf;
  HalBuf *ref_buf;
  HalBuf *recon_buf;
  HalEncTask *enc_task;
  HalEncTask *task_local;
  H265eVepu511Frame *regs_local;
  H265eV511HalContext *ctx_local;
  
  buffer = task->md_info;
  pVVar1 = ctx->frm;
  pHVar2 = ctx->syn;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x445);
  }
  RVar4 = mpp_buffer_get_fd_with_caller(task->input,"vepu511_h265_set_hw_address");
  (regs->common).adr_src0 = RVar4;
  (regs->common).adr_src1 = (regs->common).adr_src0;
  (regs->common).adr_src2 = (regs->common).adr_src0;
  pHVar5 = hal_bufs_get_buf(ctx->dpb_bufs,pVVar1->hal_curr_idx);
  pHVar6 = hal_bufs_get_buf(ctx->dpb_bufs,pVVar1->hal_refr_idx);
  if ((pHVar2->sp).non_reference_flag == 0) {
    RVar4 = mpp_buffer_get_fd_with_caller(*pHVar5->buf,"vepu511_h265_set_hw_address");
    (regs->common).rfpw_h_addr = RVar4;
    (regs->common).rfpw_b_addr = (regs->common).rfpw_h_addr;
    mpp_dev_multi_offset_update(ctx->reg_cfg,0xa4,ctx->fbc_header_len);
  }
  RVar4 = mpp_buffer_get_fd_with_caller(*pHVar6->buf,"vepu511_h265_set_hw_address");
  (regs->common).rfpr_h_addr = RVar4;
  (regs->common).rfpr_b_addr = (regs->common).rfpr_h_addr;
  RVar4 = mpp_buffer_get_fd_with_caller(pHVar5->buf[2],"vepu511_h265_set_hw_address");
  (regs->common).colmvw_addr = RVar4;
  RVar4 = mpp_buffer_get_fd_with_caller(pHVar6->buf[2],"vepu511_h265_set_hw_address");
  (regs->common).colmvr_addr = RVar4;
  RVar4 = mpp_buffer_get_fd_with_caller(pHVar5->buf[1],"vepu511_h265_set_hw_address");
  (regs->common).dspw_addr = RVar4;
  RVar4 = mpp_buffer_get_fd_with_caller(pHVar6->buf[1],"vepu511_h265_set_hw_address");
  (regs->common).dspr_addr = RVar4;
  mpp_dev_multi_offset_update(ctx->reg_cfg,0xa6,ctx->fbc_header_len);
  if (buffer == (MppBuffer)0x0) {
    (regs->common).enc_pic =
         (anon_struct_4_15_c9499a39_for_enc_pic)((uint)(regs->common).enc_pic & 0xfffffff7);
    (regs->common).meiw_addr = 0;
  }
  else {
    (regs->common).enc_pic =
         (anon_struct_4_15_c9499a39_for_enc_pic)((uint)(regs->common).enc_pic & 0xfffffff7 | 8);
    RVar4 = mpp_buffer_get_fd_with_caller(buffer,"vepu511_h265_set_hw_address");
    (regs->common).meiw_addr = RVar4;
  }
  RVar4 = mpp_buffer_get_fd_with_caller(task->output,"vepu511_h265_set_hw_address");
  (regs->common).bsbt_addr = RVar4;
  (regs->common).bsbb_addr = (regs->common).bsbt_addr;
  (regs->common).bsbr_addr = (regs->common).bsbt_addr;
  (regs->common).adr_bsbs = (regs->common).bsbt_addr;
  (regs->common).rfpt_h_addr = 0xffffffff;
  (regs->common).rfpb_h_addr = 0;
  (regs->common).rfpt_b_addr = 0xffffffff;
  (regs->common).adr_rfpb_b = 0;
  (regs->common).adr_roir = 0;
  pMVar3 = ctx->reg_cfg;
  sVar7 = mpp_packet_get_length(task->packet);
  mpp_dev_multi_offset_update(pMVar3,0xae,(RK_U32)sVar7);
  pMVar3 = ctx->reg_cfg;
  sVar7 = mpp_buffer_get_size_with_caller(task->output,"vepu511_h265_set_hw_address");
  mpp_dev_multi_offset_update(pMVar3,0xac,(RK_U32)sVar7);
  RVar4 = mpp_frame_get_offset_y(task->frame);
  (regs->common).pic_ofst =
       (anon_struct_4_4_fd8500c5_for_pic_ofst)
       ((uint)(regs->common).pic_ofst & 0xc000ffff | (RVar4 & 0x3fff) << 0x10);
  RVar4 = mpp_frame_get_offset_x(task->frame);
  (regs->common).pic_ofst =
       (anon_struct_4_4_fd8500c5_for_pic_ofst)
       ((uint)(regs->common).pic_ofst & 0xffffc000 | RVar4 & 0x3fff);
  RVar4 = mpp_buffer_get_fd_with_caller(pHVar6->buf[3],"vepu511_h265_set_hw_address");
  (regs->common).adr_smear_rd = RVar4;
  RVar4 = mpp_buffer_get_fd_with_caller(pHVar5->buf[3],"vepu511_h265_set_hw_address");
  (regs->common).adr_smear_wr = RVar4;
  return;
}

Assistant:

static void vepu511_h265_set_hw_address(H265eV511HalContext *ctx, H265eVepu511Frame *regs,
                                        HalEncTask *task)
{
    HalEncTask *enc_task = task;
    HalBuf *recon_buf, *ref_buf;
    MppBuffer md_info_buf = enc_task->md_info;
    Vepu511H265eFrmCfg *frm = ctx->frm;
    H265eSyntax_new *syn = ctx->syn;

    hal_h265e_enter();

    regs->common.adr_src0  = mpp_buffer_get_fd(enc_task->input);
    regs->common.adr_src1  = regs->common.adr_src0;
    regs->common.adr_src2  = regs->common.adr_src0;

    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, frm->hal_curr_idx);
    ref_buf = hal_bufs_get_buf(ctx->dpb_bufs, frm->hal_refr_idx);

    if (!syn->sp.non_reference_flag) {
        regs->common.rfpw_h_addr  = mpp_buffer_get_fd(recon_buf->buf[0]);
        regs->common.rfpw_b_addr  = regs->common.rfpw_h_addr;
        mpp_dev_multi_offset_update(ctx->reg_cfg, 164, ctx->fbc_header_len);
    }
    regs->common.rfpr_h_addr = mpp_buffer_get_fd(ref_buf->buf[0]);
    regs->common.rfpr_b_addr = regs->common.rfpr_h_addr;
    regs->common.colmvw_addr = mpp_buffer_get_fd(recon_buf->buf[2]);
    regs->common.colmvr_addr = mpp_buffer_get_fd(ref_buf->buf[2]);
    regs->common.dspw_addr = mpp_buffer_get_fd(recon_buf->buf[1]);
    regs->common.dspr_addr = mpp_buffer_get_fd(ref_buf->buf[1]);

    mpp_dev_multi_offset_update(ctx->reg_cfg, 166, ctx->fbc_header_len);

    if (md_info_buf) {
        regs->common.enc_pic.mei_stor = 1;
        regs->common.meiw_addr = mpp_buffer_get_fd(md_info_buf);
    } else {
        regs->common.enc_pic.mei_stor = 0;
        regs->common.meiw_addr = 0;
    }

    regs->common.bsbt_addr = mpp_buffer_get_fd(enc_task->output);
    /* TODO: stream size relative with syntax */
    regs->common.bsbb_addr  = regs->common.bsbt_addr;
    regs->common.bsbr_addr  = regs->common.bsbt_addr;
    regs->common.adr_bsbs   = regs->common.bsbt_addr;

    regs->common.rfpt_h_addr = 0xffffffff;
    regs->common.rfpb_h_addr = 0;
    regs->common.rfpt_b_addr = 0xffffffff;
    regs->common.adr_rfpb_b  = 0;
    regs->common.adr_roir    = 0;

    mpp_dev_multi_offset_update(ctx->reg_cfg, 174, mpp_packet_get_length(task->packet));
    mpp_dev_multi_offset_update(ctx->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));

    regs->common.pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->common.pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    /* smear bufs */
    regs->common.adr_smear_rd = mpp_buffer_get_fd(ref_buf->buf[3]);
    regs->common.adr_smear_wr = mpp_buffer_get_fd(recon_buf->buf[3]);
}